

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

void leaveFullscreenMode(_GLFWwindow *window)

{
  undefined4 local_d8 [2];
  XEvent event;
  unsigned_long value;
  _GLFWwindow *window_local;
  
  value = (unsigned_long)window;
  _glfwRestoreVideoMode(window->monitor);
  _glfw.x11.saver.count = _glfw.x11.saver.count + -1;
  if (_glfw.x11.saver.count == 0) {
    XSetScreenSaver(_glfw.x11.display,_glfw.x11.saver.timeout,_glfw.x11.saver.interval,
                    _glfw.x11.saver.blanking,_glfw.x11.saver.exposure);
  }
  if (_glfw.x11.NET_WM_BYPASS_COMPOSITOR != 0) {
    event.pad[0x17] = 0;
    XChangeProperty(_glfw.x11.display,*(undefined8 *)(value + 0x250),
                    _glfw.x11.NET_WM_BYPASS_COMPOSITOR,6,0x20,0,event.pad + 0x17,1);
  }
  if ((_glfw.x11.NET_WM_STATE != 0) && (_glfw.x11.NET_WM_STATE_FULLSCREEN != 0)) {
    memset(local_d8,0,0xc0);
    local_d8[0] = 0x21;
    event.xany.display = (Display *)*(undefined8 *)(value + 0x250);
    event.xfocus.mode = 0x20;
    event.xany.window = _glfw.x11.NET_WM_STATE;
    event.xkey.subwindow = 0;
    event.xselectionrequest.target = _glfw.x11.NET_WM_STATE_FULLSCREEN;
    event.xselectionrequest.property = 0;
    event.xconfigure.above = 1;
    XSendEvent(_glfw.x11.display,_glfw.x11.root,0,0x180000,local_d8);
  }
  return;
}

Assistant:

static void leaveFullscreenMode(_GLFWwindow* window)
{
    _glfwRestoreVideoMode(window->monitor);

    _glfw.x11.saver.count--;

    if (_glfw.x11.saver.count == 0)
    {
        // Restore old screen saver settings
        XSetScreenSaver(_glfw.x11.display,
                        _glfw.x11.saver.timeout,
                        _glfw.x11.saver.interval,
                        _glfw.x11.saver.blanking,
                        _glfw.x11.saver.exposure);
    }

    if (_glfw.x11.NET_WM_BYPASS_COMPOSITOR)
    {
        const unsigned long value = 0;

        XChangeProperty(_glfw.x11.display,  window->x11.handle,
                        _glfw.x11.NET_WM_BYPASS_COMPOSITOR, XA_CARDINAL, 32,
                        PropModeReplace, (unsigned char*) &value, 1);
    }

    if (_glfw.x11.NET_WM_STATE && _glfw.x11.NET_WM_STATE_FULLSCREEN)
    {
        // Ask the window manager to make the GLFW window a normal window
        // Normal windows usually have frames and other decorations

        XEvent event;
        memset(&event, 0, sizeof(event));

        event.type = ClientMessage;
        event.xclient.window = window->x11.handle;
        event.xclient.format = 32; // Data is 32-bit longs
        event.xclient.message_type = _glfw.x11.NET_WM_STATE;
        event.xclient.data.l[0] = _NET_WM_STATE_REMOVE;
        event.xclient.data.l[1] = _glfw.x11.NET_WM_STATE_FULLSCREEN;
        event.xclient.data.l[2] = 0; // No secondary property
        event.xclient.data.l[3] = 1; // Sender is a normal application

        XSendEvent(_glfw.x11.display,
                   _glfw.x11.root,
                   False,
                   SubstructureNotifyMask | SubstructureRedirectMask,
                   &event);
    }
}